

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BigIndex * __thiscall Js::JavascriptArray::BigIndex::operator++(BigIndex *this)

{
  if (this->index == 0xffffffff) {
    this->bigIndex = this->bigIndex + 1;
  }
  else {
    this->index = this->index + 1;
  }
  return this;
}

Assistant:

const JavascriptArray::BigIndex& JavascriptArray::BigIndex::operator++()
    {
        if (IsSmallIndex())
        {
            ++index;
            // If index reaches InvalidIndex, we will start to use bigIndex which is initially InvalidIndex.
        }
        else
        {
            bigIndex = bigIndex + 1;
        }

        return *this;
    }